

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O2

void __thiscall
amrex::ForkJoin::ForkJoin(ForkJoin *this,Vector<double,_std::allocator<double>_> *task_rank_pct)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  int iVar3;
  size_type __n;
  size_type sVar4;
  Vector<int,_std::allocator<int>_> task_rank_n;
  allocator_type local_59;
  double local_58;
  double local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  this->flag_verbose = false;
  this->flag_invoked = false;
  (this->split_bounds).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->split_bounds).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->split_bounds).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  this->task_me = -1;
  p_Var1 = &(this->dms)._M_t._M_impl.super__Rb_tree_header;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->data)._M_h._M_buckets = &(this->data)._M_h._M_single_bucket;
  (this->data)._M_h._M_bucket_count = 1;
  (this->data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->data)._M_h._M_element_count = 0;
  (this->data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->data)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&this->task_output_dir,"",(allocator *)&local_48);
  iVar3 = *(int *)(DAT_006e0650 + -0x38);
  __n = (long)(task_rank_pct->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(task_rank_pct->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,&local_59);
  local_50 = (double)iVar3;
  sVar4 = 0;
  if ((long)__n < 1) {
    __n = sVar4;
  }
  local_58 = 0.0;
  iVar3 = 0;
  for (; __n != sVar4; sVar4 = sVar4 + 1) {
    local_58 = local_58 +
               (task_rank_pct->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[sVar4];
    lVar2 = lround(local_58 * local_50);
    local_48._M_impl.super__Vector_impl_data._M_start[sVar4] = (int)lVar2 - iVar3;
    iVar3 = (int)lVar2;
  }
  init(this,(EVP_PKEY_CTX *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

ForkJoin::ForkJoin (const Vector<double> &task_rank_pct)
{
    auto rank_n = ParallelContext::NProcsSub(); // number of ranks in current frame
    auto ntasks = task_rank_pct.size();
    Vector<int> task_rank_n(ntasks);
    int prev = 0;
    double accum = 0;
    for (int i = 0; i < ntasks; ++i) {
        accum += task_rank_pct[i];
        int cur = std::lround(rank_n * accum);
        task_rank_n[i] = cur - prev;
        prev = cur;
    }

    init(task_rank_n);
}